

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::hufCompress(unsigned_short *raw,int nRaw,char *compressed)

{
  uint i;
  char **pcode;
  char *in_RDX;
  int in_ESI;
  unsigned_short *in_RDI;
  int data_length;
  int nBits;
  char *dataStart;
  int tableLength;
  char *tableEnd;
  char *tableStart;
  int iM;
  int im;
  longlong freq [65537];
  int *in_stack_000c0000;
  int *in_stack_000c0008;
  longlong *in_stack_000c0010;
  char **out;
  uint i_00;
  uint i_01;
  unsigned_short *in_stack_fffffffffff7ffd8;
  longlong *in_stack_fffffffffff7ffe0;
  int local_4;
  
  if (in_ESI == 0) {
    local_4 = 0;
  }
  else {
    countFrequencies((longlong *)&stack0xfffffffffff7ffd8,in_RDI,in_ESI);
    i_01 = 0;
    i_00 = 0;
    hufBuildEncTable(in_stack_000c0010,in_stack_000c0008,in_stack_000c0000);
    pcode = (char **)(in_RDX + 0x14);
    out = pcode;
    hufPackEncTable((longlong *)CONCAT44(i_01,i_00),(int)((ulong)pcode >> 0x20),(int)pcode,pcode);
    i = hufEncode(in_stack_fffffffffff7ffe0,in_stack_fffffffffff7ffd8,i_01,i_00,(char *)out);
    writeUInt(in_RDX,i_01);
    writeUInt(in_RDX + 4,i_00);
    writeUInt(in_RDX + 8,(int)pcode - (int)out);
    writeUInt(in_RDX + 0xc,i);
    writeUInt(in_RDX + 0x10,0);
    local_4 = ((int)pcode + (int)(i + 7) / 8) - (int)in_RDX;
  }
  return local_4;
}

Assistant:

int hufCompress(const unsigned short raw[], int nRaw, char compressed[]) {
  if (nRaw == 0) return 0;

  long long freq[HUF_ENCSIZE];

  countFrequencies(freq, raw, nRaw);

  int im = 0;
  int iM = 0;
  hufBuildEncTable(freq, &im, &iM);

  char *tableStart = compressed + 20;
  char *tableEnd = tableStart;
  hufPackEncTable(freq, im, iM, &tableEnd);
  int tableLength = tableEnd - tableStart;

  char *dataStart = tableEnd;
  int nBits = hufEncode(freq, raw, nRaw, iM, dataStart);
  int data_length = (nBits + 7) / 8;

  writeUInt(compressed, im);
  writeUInt(compressed + 4, iM);
  writeUInt(compressed + 8, tableLength);
  writeUInt(compressed + 12, nBits);
  writeUInt(compressed + 16, 0);  // room for future extensions

  return dataStart + data_length - compressed;
}